

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Point_Object_State_PDU::Point_Object_State_PDU
          (Point_Object_State_PDU *this,Header *H,KDataStream *stream)

{
  KDataStream *stream_local;
  Header *H_local;
  Point_Object_State_PDU *this_local;
  
  Object_State_Header::Object_State_Header(&this->super_Object_State_Header,H);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Point_Object_State_PDU_0032f418;
  DATA_TYPE::ObjectType::ObjectType(&this->m_ObjTyp);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Loc);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  DATA_TYPE::PointObjectAppearance::PointObjectAppearance(&this->m_Apperance);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_ReqID);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_RecvID);
  (*(this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Point_Object_State_PDU::Point_Object_State_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Object_State_Header( H )
{
    Decode( stream, true );
}